

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinaryBinsSelectExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::BinaryBinsSelectExpr,slang::ast::BinsSelectExpr_const&,slang::ast::BinsSelectExpr_const&,slang::ast::BinaryBinsSelectExpr::Op&>
          (BumpAllocator *this,BinsSelectExpr *args,BinsSelectExpr *args_1,Op *args_2)

{
  BinaryBinsSelectExpr *pBVar1;
  BinsSelectExpr *in_RCX;
  BinsSelectExpr *in_RDX;
  BinaryBinsSelectExpr *in_RSI;
  BumpAllocator *in_RDI;
  
  pBVar1 = (BinaryBinsSelectExpr *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  ast::BinaryBinsSelectExpr::BinaryBinsSelectExpr(in_RSI,in_RDX,in_RCX,(Op)((ulong)pBVar1 >> 0x20));
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }